

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_ManSetDefaultParams(Wlc_Par_t *pPars)

{
  *(undefined8 *)&pPars->RunId = 0;
  pPars->pFuncStop = (_func_int_int *)0x0;
  pPars->nBitsAdd = 1000000000;
  pPars->nBitsMul = 1000000000;
  pPars->nBitsMux = 1000000000;
  pPars->nBitsFlop = 1000000000;
  pPars->nIterMax = 1000;
  pPars->nLimit = 1000000000;
  pPars->fXorOutput = 1;
  pPars->fCheckClauses = 1;
  pPars->fPushClauses = 0;
  pPars->fMFFC = 1;
  pPars->fPdra = 0;
  pPars->fLoadTrace = 1;
  pPars->fProofRefine = 0;
  pPars->fHybrid = 1;
  pPars->fCheckCombUnsat = 0;
  pPars->fAbs2 = 0;
  pPars->fProofUsePPI = 0;
  pPars->fUseBmc3 = 0;
  pPars->fShrinkAbs = 0;
  pPars->fShrinkScratch = 0;
  pPars->fVerbose = 0;
  pPars->fPdrVerbose = 0;
  return;
}

Assistant:

void Wlc_ManSetDefaultParams( Wlc_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Wlc_Par_t) );
    pPars->nBitsAdd      = ABC_INFINITY;   // adder bit-width
    pPars->nBitsMul      = ABC_INFINITY;   // multiplier bit-widht 
    pPars->nBitsMux      = ABC_INFINITY;   // MUX bit-width
    pPars->nBitsFlop     = ABC_INFINITY;   // flop bit-width
    pPars->nIterMax      =         1000;   // the max number of iterations
    pPars->nLimit        = ABC_INFINITY;   // the max number of signals
    pPars->fXorOutput    =            1;   // XOR outputs of word-level miter
    pPars->fCheckClauses =            1;   // Check clauses in the reloaded trace                    
    pPars->fPushClauses  =            0;   // Push clauses in the reloaded trace                    
    pPars->fMFFC         =            1;   // Refine the entire MFFC of a PPI 
    pPars->fPdra         =            0;   // Use pdr -nct 
    pPars->fLoadTrace    =            1;   // Load previous PDR traces 
    pPars->fProofRefine  =            0;   // Use proof-based refinement
    pPars->fHybrid       =            1;   // Use a hybrid of CBR and PBR
    pPars->fCheckCombUnsat =          0;   // Check if ABS becomes comb. unsat
    pPars->fAbs2         =            0;   // Use UFAR style createAbs
    pPars->fProofUsePPI  =            0;   // Use PPI values in PBR
    pPars->fUseBmc3      =            0;   // Run BMC3 in parallel
    pPars->fShrinkAbs    =            0;   // Shrink Abs with BMC
    pPars->fShrinkScratch=            0;   // Restart pdr from scratch after shrinking
    pPars->fVerbose      =            0;   // verbose output`
    pPars->fPdrVerbose   =            0;   // show verbose PDR output
}